

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

size_t __thiscall cmMakefile::GetRecursionDepthLimit(cmMakefile *this)

{
  bool bVar1;
  cmValue cVar2;
  undefined8 uVar3;
  unsigned_long depthUL;
  unsigned_long depthUL_1;
  allocator<char> local_51;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_50;
  char local_30;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50._M_value,"CMAKE_MAXIMUM_RECURSION_DEPTH",
             (allocator<char> *)&local_28);
  cVar2 = GetDefinition(this,&local_50._M_value);
  std::__cxx11::string::~string((string *)&local_50._M_value);
  if (cVar2.Value == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_51);
    cmSystemTools::GetEnvVar
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_50._M_value,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    uVar3 = (pointer)0x3e8;
    if (local_30 == '\x01') {
      bVar1 = cmStrToULong(&local_50._M_value,(unsigned_long *)&local_28);
      uVar3 = (pointer)0x3e8;
      if (bVar1) {
        uVar3 = local_28._M_dataplus._M_p;
      }
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_50._M_value);
  }
  else {
    bVar1 = cmStrToULong(((cVar2.Value)->_M_dataplus)._M_p,(unsigned_long *)&local_50);
    uVar3 = (pointer)0x3e8;
    if (bVar1) {
      uVar3 = local_50._M_value._M_dataplus._M_p;
    }
  }
  return (size_t)(pointer)uVar3;
}

Assistant:

size_t cmMakefile::GetRecursionDepthLimit() const
{
  size_t depth = CMake_DEFAULT_RECURSION_LIMIT;
  if (cmValue depthStr =
        this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(depthStr.GetCStr(), &depthUL)) {
      depth = depthUL;
    }
  } else if (cm::optional<std::string> depthEnv =
               cmSystemTools::GetEnvVar("CMAKE_MAXIMUM_RECURSION_DEPTH")) {
    unsigned long depthUL;
    if (cmStrToULong(*depthEnv, &depthUL)) {
      depth = depthUL;
    }
  }
  return depth;
}